

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O2

void __thiscall
setup::info::load_entries<setup::delete_entry>
          (info *this,istream *is,entry_types entries,size_t count,
          vector<setup::delete_entry,_std::allocator<setup::delete_entry>_> *result,
          enum_type entry_type)

{
  _Base_bitset<1UL> _Var1;
  long lVar2;
  bool bVar3;
  delete_entry entry;
  flags<setup::info::entry_types_Enum_,_21UL> local_160;
  delete_entry local_158;
  
  local_160._flags.super__Base_bitset<1UL>._M_w = entries._flags.super__Base_bitset<1UL>._M_w;
  std::vector<setup::delete_entry,_std::allocator<setup::delete_entry>_>::clear(result);
  _Var1._M_w = (_WordT)flags<setup::info::entry_types_Enum_,_21UL>::operator&(&local_160,entry_type)
  ;
  if ((_Base_bitset<1UL>)_Var1._M_w == (_Base_bitset<1UL>)0x0) {
    while (bVar3 = count != 0, count = count - 1, bVar3) {
      delete_entry::delete_entry(&local_158);
      delete_entry::load(&local_158,is,this);
      delete_entry::~delete_entry(&local_158);
    }
  }
  else {
    std::vector<setup::delete_entry,_std::allocator<setup::delete_entry>_>::resize(result,count);
    lVar2 = 0;
    while (bVar3 = count != 0, count = count - 1, bVar3) {
      delete_entry::load((delete_entry *)
                         ((long)&(((result->
                                   super__Vector_base<setup::delete_entry,_std::allocator<setup::delete_entry>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->super_item).
                                 components._M_dataplus + lVar2),is,this);
      lVar2 = lVar2 + 0x128;
    }
  }
  return;
}

Assistant:

void info::load_entries(std::istream & is, entry_types entries, size_t count,
                        std::vector<Entry> & result, entry_types::enum_type entry_type) {
	
	result.clear();
	if(entries & entry_type) {
		result.resize(count);
		for(size_t i = 0; i < count; i++) {
			result[i].load(is, *this);
		}
	} else {
		for(size_t i = 0; i < count; i++) {
			Entry entry;
			entry.load(is, *this);
		}
	}
}